

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int create_esni_aead(ptls_aead_context_t **aead_ctx,int is_enc,ptls_cipher_suite_t *cipher,
                    ptls_iovec_t ecdh_secret,uint8_t *esni_contents_hash)

{
  ptls_hash_algorithm_t *ppVar1;
  ptls_aead_algorithm_t *aead;
  ptls_aead_context_t *ppVar2;
  ptls_iovec_t pVar3;
  int local_7c;
  undefined1 local_78 [4];
  int ret;
  uint8_t aead_secret [64];
  uint8_t *esni_contents_hash_local;
  ptls_cipher_suite_t *cipher_local;
  int is_enc_local;
  ptls_aead_context_t **aead_ctx_local;
  ptls_iovec_t ecdh_secret_local;
  
  ppVar1 = cipher->hash;
  aead_secret._56_8_ = esni_contents_hash;
  pVar3 = ptls_iovec_init((void *)0x0,0);
  local_7c = ptls_hkdf_extract(ppVar1,local_78,pVar3,ecdh_secret);
  if (local_7c == 0) {
    aead = cipher->aead;
    ppVar1 = cipher->hash;
    pVar3 = ptls_iovec_init((void *)aead_secret._56_8_,cipher->hash->digest_size);
    ppVar2 = new_aead(aead,ppVar1,is_enc,local_78,pVar3,"tls13 esni ");
    *aead_ctx = ppVar2;
    if (ppVar2 == (ptls_aead_context_t *)0x0) {
      local_7c = 0x201;
    }
    else {
      local_7c = 0;
    }
  }
  (*ptls_clear_memory)(local_78,0x40);
  return local_7c;
}

Assistant:

static int create_esni_aead(ptls_aead_context_t **aead_ctx, int is_enc, ptls_cipher_suite_t *cipher, ptls_iovec_t ecdh_secret,
                            const uint8_t *esni_contents_hash)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_extract(cipher->hash, aead_secret, ptls_iovec_init(NULL, 0), ecdh_secret)) != 0)
        goto Exit;
    if ((*aead_ctx = new_aead(cipher->aead, cipher->hash, is_enc, aead_secret,
                              ptls_iovec_init(esni_contents_hash, cipher->hash->digest_size), "tls13 esni ")) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = 0;
Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}